

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCMatVec.h
# Opt level: O1

void chrono::collision::Meigen(PQP_REAL (*vout) [3],PQP_REAL *dout,PQP_REAL (*a) [3])

{
  undefined8 uVar1;
  double dVar2;
  long lVar3;
  PQP_REAL *pPVar4;
  PQP_REAL *pPVar5;
  ulong uVar6;
  long lVar7;
  PQP_REAL *pPVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  PQP_REAL *pPVar12;
  PQP_REAL *pPVar13;
  ulong uVar14;
  PQP_REAL *pPVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  PQP_REAL d [3];
  PQP_REAL z [3];
  PQP_REAL v [3] [3];
  PQP_REAL b [3];
  PQP_REAL local_168 [4];
  double local_148;
  PQP_REAL *local_140;
  PQP_REAL *local_138;
  PQP_REAL *local_130;
  PQP_REAL *local_128;
  ulong local_120;
  PQP_REAL *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  double local_f8 [4];
  undefined1 local_d8 [16];
  PQP_REAL local_c8;
  PQP_REAL local_c0;
  PQP_REAL PStack_b8;
  PQP_REAL local_b0;
  PQP_REAL local_a8;
  PQP_REAL local_a0;
  PQP_REAL PStack_98;
  PQP_REAL local_90;
  PQP_REAL local_88;
  PQP_REAL (*local_78) [3];
  PQP_REAL *local_70;
  PQP_REAL *local_68;
  PQP_REAL *local_60;
  double local_58;
  undefined8 uStack_50;
  double adStack_48 [3];
  
  local_70 = dout;
  local_78 = vout;
  local_88 = 1.0;
  local_a8 = 1.0;
  local_c8 = 1.0;
  local_c0 = 0.0;
  PStack_b8 = 0.0;
  lVar3 = 0;
  local_b0 = 0.0;
  local_a0 = 0.0;
  PStack_98 = 0.0;
  local_90 = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  do {
    uVar1 = *(undefined8 *)((long)*a + lVar3 * 4);
    *(undefined8 *)((long)adStack_48 + lVar3) = uVar1;
    *(undefined8 *)((long)local_168 + lVar3) = uVar1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  local_60 = *a + 1;
  local_68 = a[1] + 1;
  uVar11 = 0;
  auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  auVar41 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  local_118 = *a;
  do {
    uVar6 = 0;
    dVar16 = 0.0;
    pPVar4 = *a;
    do {
      if (uVar6 < 2) {
        lVar3 = 1;
        do {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = pPVar4[lVar3];
          auVar21 = vandpd_avx(auVar21,auVar40._0_16_);
          dVar16 = dVar16 + auVar21._0_8_;
          lVar7 = uVar6 + 1 + lVar3;
          lVar3 = lVar3 + 1;
        } while (lVar7 != 3);
      }
      uVar6 = uVar6 + 1;
      pPVar4 = pPVar4 + 4;
    } while (uVar6 != 3);
    if ((dVar16 == 0.0) && (!NAN(dVar16))) {
      (*local_78)[0] = local_c8;
      (*local_78)[1] = local_c0;
      (*local_78)[2] = PStack_b8;
      local_78[1][0] = local_b0;
      local_78[1][1] = local_a8;
      local_78[1][2] = local_a0;
      local_78[2][0] = PStack_98;
      local_78[2][1] = local_90;
      local_78[2][2] = local_88;
      *local_70 = local_168[0];
      local_70[1] = local_168[1];
      local_70[2] = local_168[2];
      return;
    }
    dVar16 = (double)((ulong)((uint)uVar11 < 3) * (long)((dVar16 * 0.2) / 9.0));
    local_120 = 1;
    local_128 = &local_c0;
    pPVar4 = &local_c8;
    local_130 = local_68;
    local_110 = uVar11;
    local_58 = dVar16;
    uStack_50 = 0;
    pPVar8 = local_60;
    uVar6 = 0;
    do {
      uVar9 = uVar6 + 1;
      if (uVar6 < 2) {
        lVar3 = 0;
        local_100 = uVar9;
        local_108 = uVar6;
        pPVar13 = local_128;
        uVar14 = local_120;
        pPVar15 = local_130;
        do {
          pPVar12 = (PQP_REAL *)((long)a + uVar6 * 3 * 8);
          pPVar5 = pPVar12 + uVar14;
          dVar17 = *pPVar5;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar17;
          auVar33 = auVar40._0_16_;
          auVar21 = vandpd_avx(auVar18,auVar33);
          dVar20 = auVar21._0_8_ * 100.0;
          if ((uint)uVar11 < 4) {
LAB_00851877:
            if (dVar16 < auVar21._0_8_) {
              dVar29 = local_168[uVar6];
              dVar2 = local_168[uVar14] - dVar29;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = dVar2;
              auVar21 = vandpd_avx(auVar23,auVar33);
              dVar30 = auVar21._0_8_;
              if ((dVar20 + dVar30 != dVar30) || (NAN(dVar20 + dVar30) || NAN(dVar30))) {
                auVar33._0_8_ = (dVar2 * 0.5) / dVar17;
                auVar33._8_8_ = 0;
                auVar21 = vfmadd213sd_fma(auVar33,auVar33,auVar41._0_16_);
                if (auVar21._0_8_ < 0.0) {
                  local_148 = dVar29;
                  local_140 = pPVar5;
                  local_138 = pPVar12;
                  local_d8 = auVar33;
                  dVar17 = sqrt(auVar21._0_8_);
                  auVar41 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
                  pPVar5 = local_140;
                  a = (PQP_REAL (*) [3])local_118;
                  uVar9 = local_100;
                  uVar6 = local_108;
                  uVar11 = local_110;
                  pPVar12 = local_138;
                  auVar33 = local_d8;
                  dVar29 = local_148;
                  dVar16 = local_58;
                }
                else {
                  auVar21 = vsqrtsd_avx(auVar21,auVar21);
                  dVar17 = auVar21._0_8_;
                }
                auVar21 = vandpd_avx(auVar33,auVar40._0_16_);
                auVar24._0_8_ = auVar41._0_8_ / (auVar21._0_8_ + dVar17);
                auVar24._8_8_ = auVar41._8_8_;
                if (auVar33._0_8_ < 0.0) {
                  auVar24._0_8_ = -auVar24._0_8_;
                  auVar24._8_8_ = auVar41._8_8_ ^ 0x8000000000000000;
                }
              }
              else {
                auVar24._0_8_ = dVar17 / dVar2;
                auVar24._8_8_ = 0;
              }
              auVar21 = vfmadd213sd_fma(auVar24,auVar24,auVar41._0_16_);
              if (auVar21._0_8_ < 0.0) {
                local_148 = dVar29;
                local_140 = pPVar5;
                local_138 = pPVar12;
                local_d8 = auVar24;
                dVar20 = sqrt(auVar21._0_8_);
                auVar41 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
                pPVar5 = local_140;
                a = (PQP_REAL (*) [3])local_118;
                uVar9 = local_100;
                uVar6 = local_108;
                uVar11 = local_110;
                pPVar12 = local_138;
                dVar17 = (double)local_d8._0_8_;
                dVar29 = local_148;
                dVar16 = local_58;
              }
              else {
                auVar21 = vsqrtsd_avx(auVar21,auVar21);
                dVar20 = auVar21._0_8_;
                dVar17 = auVar24._0_8_;
              }
              dVar20 = auVar41._0_8_ / dVar20;
              dVar2 = dVar17 * dVar20;
              auVar22._0_8_ = dVar2 / (auVar41._0_8_ + dVar20);
              auVar22._8_8_ = 0;
              dVar17 = dVar17 * *pPVar5;
              local_f8[uVar6] = local_f8[uVar6] - dVar17;
              local_f8[uVar14] = dVar17 + local_f8[uVar14];
              local_168[uVar6] = dVar29 - dVar17;
              local_168[uVar14] = dVar17 + local_168[uVar14];
              *pPVar5 = 0.0;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = dVar2;
              if (uVar6 == 1) {
                auVar25._8_8_ = 0;
                auVar25._0_8_ = *(PQP_REAL *)((long)a + 8);
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(PQP_REAL *)((long)a + uVar14 * 8);
                auVar21 = vfmadd213sd_fma(auVar22,auVar25,auVar34);
                auVar21 = vfnmadd213sd_fma(auVar21,auVar19,auVar25);
                *(PQP_REAL *)((long)a + 8) = auVar21._0_8_;
                auVar21 = vfnmadd231sd_fma(auVar25,auVar34,auVar22);
                auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar34);
                *(PQP_REAL *)((long)a + uVar14 * 8) = auVar21._0_8_;
              }
              if (uVar9 < uVar14) {
                auVar26._0_8_ = -dVar2;
                auVar26._8_8_ = 0x8000000000000000;
                lVar7 = 0;
                pPVar5 = pPVar15;
                do {
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = pPVar8[lVar7];
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = *pPVar5;
                  auVar21 = vfmadd213sd_fma(auVar22,auVar35,auVar38);
                  auVar21 = vfmadd213sd_fma(auVar21,auVar26,auVar35);
                  pPVar8[lVar7] = auVar21._0_8_;
                  auVar21 = vfnmadd231sd_fma(auVar35,auVar38,auVar22);
                  auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar38);
                  *pPVar5 = auVar21._0_8_;
                  lVar7 = lVar7 + 1;
                  pPVar5 = pPVar5 + 3;
                } while (lVar3 != lVar7);
              }
              if (uVar14 < 2) {
                auVar27._8_8_ = 0;
                auVar27._0_8_ = pPVar12[uVar14 + 1];
                auVar36._8_8_ = 0;
                auVar36._0_8_ = *(PQP_REAL *)((long)a + (uVar14 * 4 + 1) * 8);
                auVar21 = vfmadd213sd_fma(auVar22,auVar27,auVar36);
                auVar21 = vfnmadd213sd_fma(auVar21,auVar19,auVar27);
                pPVar12[uVar14 + 1] = auVar21._0_8_;
                auVar21 = vfnmadd231sd_fma(auVar27,auVar36,auVar22);
                auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar36);
                *(PQP_REAL *)((long)a + (uVar14 * 4 + 1) * 8) = auVar21._0_8_;
              }
              auVar28._0_8_ = -dVar2;
              auVar28._8_8_ = 0x8000000000000000;
              lVar7 = 0;
              do {
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)((long)pPVar4 + lVar7);
                auVar39._8_8_ = 0;
                auVar39._0_8_ = *(ulong *)((long)pPVar13 + lVar7);
                auVar21 = vfmadd213sd_fma(auVar22,auVar37,auVar39);
                auVar21 = vfmadd213sd_fma(auVar21,auVar28,auVar37);
                *(long *)((long)pPVar4 + lVar7) = auVar21._0_8_;
                auVar21 = vfnmadd231sd_fma(auVar37,auVar39,auVar22);
                auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar39);
                *(long *)((long)pPVar13 + lVar7) = auVar21._0_8_;
                lVar7 = lVar7 + 0x18;
              } while (lVar7 != 0x48);
            }
          }
          else {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_168[uVar6];
            auVar18 = vandpd_avx(auVar31,auVar33);
            dVar29 = auVar18._0_8_;
            if ((dVar20 + dVar29 != dVar29) || (NAN(dVar20 + dVar29) || NAN(dVar29)))
            goto LAB_00851877;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_168[uVar14];
            auVar18 = vandpd_avx(auVar32,auVar33);
            dVar29 = auVar18._0_8_;
            if ((dVar20 + dVar29 != dVar29) || (NAN(dVar20 + dVar29) || NAN(dVar29)))
            goto LAB_00851877;
            *pPVar5 = 0.0;
          }
          uVar14 = uVar14 + 1;
          pPVar15 = pPVar15 + 1;
          lVar3 = lVar3 + 1;
          pPVar13 = pPVar13 + 1;
        } while (uVar14 != 3);
      }
      local_120 = local_120 + 1;
      pPVar8 = pPVar8 + 4;
      local_130 = local_130 + 4;
      pPVar4 = pPVar4 + 1;
      local_128 = local_128 + 1;
      uVar6 = uVar9;
    } while (uVar9 != 3);
    lVar3 = 0;
    do {
      dVar16 = adStack_48[lVar3];
      adStack_48[lVar3] = local_f8[lVar3] + dVar16;
      local_168[lVar3] = local_f8[lVar3] + dVar16;
      local_f8[lVar3] = 0.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 0x32) {
      Meigen();
      return;
    }
  } while( true );
}

Assistant:

void inline Meigen(PQP_REAL vout[3][3], PQP_REAL dout[3], PQP_REAL a[3][3]) {
    int n = 3;
    int j, iq, ip, i;
    PQP_REAL tresh, theta, tau, t, sm, s, h, g, c;
    int nrot;
    PQP_REAL b[3];
    PQP_REAL z[3];
    PQP_REAL v[3][3];
    PQP_REAL d[3];

    Midentity(v);
    for (ip = 0; ip < n; ip++) {
        b[ip] = a[ip][ip];
        d[ip] = a[ip][ip];
        z[ip] = 0.0;
    }

    nrot = 0;

    for (i = 0; i < 50; i++) {
        sm = 0.0;
        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++)
                sm += fabs(a[ip][iq]);
        if (sm == 0.0) {
            McM(vout, v);
            VcV(dout, d);
            return;
        }

        if (i < 3)
            tresh = (PQP_REAL)0.2 * sm / (n * n);
        else
            tresh = 0.0;

        for (ip = 0; ip < n; ip++)
            for (iq = ip + 1; iq < n; iq++) {
                g = (PQP_REAL)100.0 * fabs(a[ip][iq]);
                if (i > 3 && fabs(d[ip]) + g == fabs(d[ip]) && fabs(d[iq]) + g == fabs(d[iq]))
                    a[ip][iq] = 0.0;
                else if (fabs(a[ip][iq]) > tresh) {
                    h = d[iq] - d[ip];
                    if (fabs(h) + g == fabs(h))
                        t = (a[ip][iq]) / h;
                    else {
                        theta = (PQP_REAL)0.5 * h / (a[ip][iq]);
                        t = (PQP_REAL)(1.0 / (fabs(theta) + sqrt(1.0 + theta * theta)));
                        if (theta < 0.0)
                            t = -t;
                    }
                    c = (PQP_REAL)1.0 / sqrt(1 + t * t);
                    s = t * c;
                    tau = s / ((PQP_REAL)1.0 + c);
                    h = t * a[ip][iq];
                    z[ip] -= h;
                    z[iq] += h;
                    d[ip] -= h;
                    d[iq] += h;
                    a[ip][iq] = 0.0;
                    for (j = 0; j < ip; j++) {
                        ROTATE(a, j, ip, j, iq);
                    }
                    for (j = ip + 1; j < iq; j++) {
                        ROTATE(a, ip, j, j, iq);
                    }
                    for (j = iq + 1; j < n; j++) {
                        ROTATE(a, ip, j, iq, j);
                    }
                    for (j = 0; j < n; j++) {
                        ROTATE(v, j, ip, j, iq);
                    }
                    nrot++;
                }
            }
        for (ip = 0; ip < n; ip++) {
            b[ip] += z[ip];
            d[ip] = b[ip];
            z[ip] = 0.0;
        }
    }

    fprintf(stderr, "eigen: too many iterations in Jacobi transform.\n");

    return;
}